

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoissonGenerator.h
# Opt level: O3

void __thiscall PoissonGenerator::Grid::Grid(Grid *this,int w,int h,float cellSize)

{
  pointer this_00;
  
  this->w_ = w;
  this->h_ = h;
  this->cellSize_ = cellSize;
  (this->grid_).
  super__Vector_base<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grid_).
  super__Vector_base<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grid_).
  super__Vector_base<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
  ::resize(&this->grid_,(long)h);
  this_00 = (this->grid_).
            super__Vector_base<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (this_00 !=
      (this->grid_).
      super__Vector_base<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::resize
                (this_00,(long)w);
      this_00 = this_00 + 1;
    } while (this_00 !=
             (this->grid_).
             super__Vector_base<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>,_std::allocator<std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

Grid(int w, int h, float cellSize) : w_(w), h_(h), cellSize_(cellSize) {
    grid_.resize(h_);
    for (auto i = grid_.begin(); i != grid_.end(); i++) {
      i->resize(w);
    }
  }